

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase464::run(TestCase464 *this)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  SourceLocation location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar2;
  OwnPromiseNode OVar3;
  void *pvVar4;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:478:59)>
  *location_01;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:480:11)>
  *location_02;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:471:54)>
  *location_03;
  PromiseBase location_04;
  OwnPromiseNode intermediate;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_148;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_140;
  OwnPromiseNode intermediate_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_130;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_128;
  OwnPromiseNode local_120;
  String result2;
  void *continuationTracePtr_1;
  String *pSStack_f8;
  char *local_f0;
  bool local_e0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:473:11),_unsigned_long>
  promise;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  String result;
  TwoWayPipe pipe;
  AsyncIoContext ioContext;
  
  setupAsyncIo();
  (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[1])(&pipe);
  receiveBuffer1[0] = '\0';
  receiveBuffer1[1] = '\0';
  receiveBuffer1[2] = '\0';
  receiveBuffer1[3] = '\0';
  receiveBuffer2[0] = '\0';
  receiveBuffer2[1] = '\0';
  receiveBuffer2[2] = '\0';
  receiveBuffer2[3] = '\0';
  (**((pipe.ends[0].ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_148,&(pipe.ends[0].ptr)->super_AsyncOutputStream,&kj::_::ByteLiteral<4ul>,3);
  result2.content.ptr =
       (char *)kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:471:54)>
               ::anon_class_16_2_40a49b79_for_func::operator();
  pPVar1 = ((local_148.ptr)->super_PromiseArenaMember).arena;
  result.content.ptr = (char *)&pipe;
  result.content.size_ = (size_t)receiveBuffer1;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_148.ptr - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    location_03 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:471:54)>
                   *)((long)pvVar4 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase464::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__0,void*&>
              (location_03,&local_148,(anon_class_16_2_40a49b79_for_func *)&result,(void **)&result2
              );
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((local_148.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_03 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:471:54)>
                   *)(local_148.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase464::run()::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__0,void*&>
              (location_03,&local_148,(anon_class_16_2_40a49b79_for_func *)&result,(void **)&result2
              );
    local_148.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  continuationTracePtr_1 = &DAT_003d3151;
  pSStack_f8 = (String *)&DAT_003d31b0;
  local_f0 = (char *)0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_03;
  kj::_::maybeChain<unsigned_long>(&local_120,(Promise<unsigned_long> *)&intermediate,location);
  OVar3.ptr = local_120.ptr;
  local_120.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_120);
  local_140.ptr = OVar3.ptr;
  intermediate_1.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  OVar2.ptr = local_140.ptr;
  continuationTracePtr_1 =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:473:11)>
       ::anon_class_8_1_8ba005cc_for_func::operator();
  pPVar1 = ((local_140.ptr)->super_PromiseArenaMember).arena;
  intermediate_1.ptr = (PromiseNode *)receiveBuffer1;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_140.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_04.node.ptr = (OwnPromiseNode)((long)pvVar4 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase464::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__1,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:473:11)>
                *)location_04.node.ptr,&local_140,
               (anon_class_8_1_8ba005cc_for_func *)&intermediate_1,&continuationTracePtr_1);
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_140.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_04.node.ptr = (OwnPromiseNode)&local_140.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase464::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__1,void*&>
              ((SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:473:11)>
                *)location_04.node.ptr,&local_140,
               (anon_class_8_1_8ba005cc_for_func *)&intermediate_1,&continuationTracePtr_1);
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  result2.content.ptr = (char *)0x0;
  intermediate.ptr = (PromiseNode *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)location_04.node.ptr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&result2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  (**((pipe.ends[1].ptr)->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_130,&(pipe.ends[1].ptr)->super_AsyncOutputStream,&kj::_::ByteLiteral<4ul>,3);
  intermediate.ptr =
       (PromiseNode *)
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:478:59)>
       ::anon_class_16_2_40a49b7a_for_func::operator();
  pPVar1 = ((local_130.ptr)->super_PromiseArenaMember).arena;
  result2.content.ptr = (char *)&pipe;
  result2.content.size_ = (size_t)receiveBuffer2;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_130.ptr - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:478:59)>
                   *)((long)pvVar4 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase464::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__2,void*&>
              (location_01,&local_130,(anon_class_16_2_40a49b7a_for_func *)&result2,
               &intermediate.ptr);
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    ((local_130.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:478:59)>
                   *)(local_130.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase464::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__2,void*&>
              (location_01,&local_130,(anon_class_16_2_40a49b7a_for_func *)&result2,
               &intermediate.ptr);
    local_130.ptr[-3].super_PromiseArenaMember.arena = pPVar1;
  }
  continuationTracePtr_1 = &DAT_003d3151;
  pSStack_f8 = (String *)&DAT_003d31b0;
  local_f0 = (char *)0x4c0000058b;
  location_00.function = &DAT_003d31b0;
  location_00.fileName = &DAT_003d3151;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  intermediate_1.ptr = (PromiseNode *)location_01;
  kj::_::maybeChain<unsigned_long>(&local_140,(Promise<unsigned_long> *)&intermediate_1,location_00)
  ;
  OVar2.ptr = local_140.ptr;
  local_140.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
  local_128.ptr = OVar2.ptr;
  local_120.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_120);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  OVar2.ptr = local_128.ptr;
  continuationTracePtr_1 =
       kj::_::
       SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:480:11)>
       ::anon_class_8_1_8ba005cd_for_func::operator();
  pPVar1 = ((local_128.ptr)->super_PromiseArenaMember).arena;
  local_120.ptr = (PromiseNode *)receiveBuffer2;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_128.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    location_02 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:480:11)>
                   *)((long)pvVar4 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase464::run()::__3>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__3,void*&>
              (location_02,&local_128,(anon_class_8_1_8ba005cd_for_func *)&local_120,
               &continuationTracePtr_1);
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_128.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_02 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:480:11)>
                   *)&local_128.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase464::run()::__3>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase464::run()::__3,void*&>
              (location_02,&local_128,(anon_class_8_1_8ba005cd_for_func *)&local_120,
               &continuationTracePtr_1);
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  intermediate.ptr = (PromiseNode *)0x0;
  intermediate_1.ptr = (PromiseNode *)0x0;
  local_148.ptr = (PromiseNode *)location_02;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_1);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Promise<kj::String>::wait((Promise<kj::String> *)&result,&local_148);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_128);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_130);
  Promise<kj::String>::wait((Promise<kj::String> *)&result2,&promise);
  intermediate.ptr = (PromiseNode *)0x423c58;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_1,
             (DebugExpression<char_const(&)[4]> *)&intermediate,&result);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1e7,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_1,
               (char (*) [4])0x423c58,&result);
  }
  intermediate.ptr = (PromiseNode *)0x401abd;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_1,
             (DebugExpression<char_const(&)[4]> *)&intermediate,&result2);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x1e8,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (result2)\", _kjCondition, \"bar\", result2"
               ,(char (*) [38])"failed: expected (\"bar\") == (result2)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_1,
               (char (*) [4])0x401abd,&result2);
  }
  Array<char>::~Array(&result2.content);
  Array<char>::~Array(&result.content);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  TwoWayPipe::~TwoWayPipe(&pipe);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, TwoWayPipe) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newTwoWayPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  auto promise = pipe.ends[0]->write("foo"_kjb).then([&]() {
    return pipe.ends[0]->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  kj::String result = pipe.ends[1]->write("bar"_kjb).then([&]() {
    return pipe.ends[1]->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer2, n);
  }).wait(ioContext.waitScope);

  kj::String result2 = promise.wait(ioContext.waitScope);

  EXPECT_EQ("foo", result);
  EXPECT_EQ("bar", result2);
}